

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

bool nonstd::span_lite::operator==
               (span<int,_18446744073709551615UL> *l,span<float,_18446744073709551615UL> *r)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  undefined1 local_1a;
  undefined1 local_19;
  span<float,_18446744073709551615UL> *r_local;
  span<int,_18446744073709551615UL> *l_local;
  
  bVar1 = same<int,18446744073709551615ul,float,18446744073709551615ul>(l,r);
  local_19 = true;
  if (!bVar1) {
    sVar2 = span<int,_18446744073709551615UL>::size(l);
    sVar3 = span<float,_18446744073709551615UL>::size(r);
    local_1a = false;
    if (sVar2 == sVar3) {
      __first1 = span<int,_18446744073709551615UL>::begin(l);
      __last1 = span<int,_18446744073709551615UL>::end(l);
      __first2 = span<float,_18446744073709551615UL>::begin(r);
      local_1a = std::equal<int*,float*>(__first1,__last1,__first2);
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

inline span_constexpr bool operator==( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return
#if span_FEATURE( SAME )
        same( l, r ) ||
#endif
        ( l.size() == r.size() && std::equal( l.begin(), l.end(), r.begin() ) );
}

template< class T1, extent_t E1, class T2, extent_t E2  >
inline span_constexpr bool operator<( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return std::lexicographical_compare( l.begin(), l.end(), r.begin(), r.end() );
}

template< class T1, extent_t E1, class T2, extent_t E2  >
inline span_constexpr bool operator!=( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return !( l == r );
}

template< class T1, extent_t E1, class T2, extent_t E2  >
inline span_constexpr bool operator<=( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return !( r < l );
}

template< class T1, extent_t E1, class T2, extent_t E2  >
inline span_constexpr bool operator>( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return ( r < l );
}

template< class T1, extent_t E1, class T2, extent_t E2  >
inline span_constexpr bool operator>=( span<T1,E1> const & l, span<T2,E2> const & r )
{
    return !( l < r );
}

#endif // span_FEATURE( COMPARISON )

// 26.7.2.6 views of object representation [span.objectrep]

#if span_HAVE( BYTE ) || span_HAVE( NONSTD_BYTE )

// Avoid MSVC 14.1 (1910), VS 2017: warning C4307: '*': integral constant overflow:

template< typename T, extent_t Extent >
struct BytesExtent
{
#if span_CPP11_OR_GREATER
    enum ET : extent_t { value = span_sizeof(T) * Extent };
#else
    enum ET { value = span_sizeof(T) * Extent };
#endif
};

template< typename T >
struct BytesExtent< T, dynamic_extent >
{
#if span_CPP11_OR_GREATER
    enum ET : extent_t { value = dynamic_extent };
#else
    enum ET { value = dynamic_extent };
#endif
};

template< class T, extent_t Extent >
inline span_constexpr span< const std17::byte, BytesExtent<T, Extent>::value >
as_bytes( span<T,Extent> spn ) span_noexcept
{
#if 0
    return { reinterpret_cast< std17::byte const * >( spn.data() ), spn.size_bytes() };
#else
    return span< const std17::byte, BytesExtent<T, Extent>::value >(
        reinterpret_cast< std17::byte const * >( spn.data() ), spn.size_bytes() );  // NOLINT
#endif
}

template< class T, extent_t Extent >
inline span_constexpr span< std17::byte, BytesExtent<T, Extent>::value >
as_writable_bytes( span<T,Extent> spn ) span_noexcept
{
#if 0
    return { reinterpret_cast< std17::byte * >( spn.data() ), spn.size_bytes() };
#else
    return span< std17::byte, BytesExtent<T, Extent>::value >(
        reinterpret_cast< std17::byte * >( spn.data() ), spn.size_bytes() );  // NOLINT
#endif
}

#endif // span_HAVE( BYTE ) || span_HAVE( NONSTD_BYTE )

// 27.8 Container and view access [iterator.container]

template< class T, extent_t Extent /*= dynamic_extent*/ >
span_constexpr std::size_t size( span<T,Extent> const & spn )
{
    return static_cast<std::size_t>( spn.size() );
}

template< class T, extent_t Extent /*= dynamic_extent*/ >
span_constexpr std::ptrdiff_t ssize( span<T,Extent> const & spn )
{
    return static_cast<std::ptrdiff_t>( spn.size() );
}

}